

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool __thiscall
caffe::LayerParameter::MergePartialFromCodedStream(LayerParameter *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  RepeatedPtrFieldBase *this_01;
  bool bVar5;
  uint32 uVar6;
  UnknownFieldSet *pUVar7;
  TransformationParameter *value_00;
  InputParameter *value_01;
  EmbedParameter *value_02;
  FlattenParameter *value_03;
  ReductionParameter *value_04;
  TanHParameter *value_05;
  LogParameter *value_06;
  InfogainLossParameter *value_07;
  CropParameter *value_08;
  HingeLossParameter *value_09;
  ReshapeParameter *value_10;
  ExpParameter *value_11;
  ConcatParameter *value_12;
  ELUParameter *value_13;
  HDF5DataParameter *value_14;
  DummyDataParameter *value_15;
  SoftmaxParameter *value_16;
  SigmoidParameter *value_17;
  AccuracyParameter *value_18;
  ImageDataParameter *value_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Type *pTVar9;
  ArgMaxParameter *value_20;
  DataParameter *value_21;
  string *psVar10;
  LossParameter *value_22;
  PReLUParameter *value_23;
  InnerProductParameter *value_24;
  ParamSpec *value_25;
  BiasParameter *value_26;
  MVNParameter *value_27;
  ContrastiveLossParameter *value_28;
  PoolingParameter *value_29;
  BlobProto *value_30;
  HDF5OutputParameter *value_31;
  ConvolutionParameter *value_32;
  NetStateRule *value_33;
  LRNParameter *value_34;
  EltwiseParameter *value_35;
  DropoutParameter *value_36;
  PythonParameter *value_37;
  SPPParameter *value_38;
  ParameterParameter *value_39;
  PowerParameter *value_40;
  BatchNormParameter *value_41;
  MemoryDataParameter *value_42;
  ScaleParameter *value_43;
  ReLUParameter *value_44;
  ThresholdParameter *value_45;
  WindowDataParameter *value_46;
  TileParameter *value_47;
  SliceParameter *value_48;
  RecurrentParameter *value_49;
  char *pcVar11;
  int size;
  pointer data;
  RepeatedPtrField<caffe::NetStateRule> *this_02;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  int value;
  RepeatedField<float> *local_68;
  RepeatedField<bool> *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrField<caffe::ParamSpec> *local_50;
  RepeatedPtrField<caffe::BlobProto> *local_48;
  RepeatedPtrField<caffe::NetStateRule> *local_40;
  RepeatedPtrField<caffe::NetStateRule> *local_38;
  
  local_60 = &this->propagate_down_;
  local_38 = &this->exclude_;
  local_40 = &this->include_;
  local_48 = &this->blobs_;
  local_50 = &this->param_;
  local_68 = &this->loss_weight_;
  this_00 = &this->top_;
  local_58 = &(this->bottom_).super_RepeatedPtrFieldBase;
LAB_00492d85:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar13 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar6 = (uint)bVar2, (~(uint)*pbVar1 & uVar13) < 0x80)) goto LAB_0049372f;
        uVar13 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar14 = (ulong)uVar13 | 0x100000000;
    }
    else {
LAB_0049372f:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar14 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar14 = 0x100000000;
      }
      uVar14 = uVar6 | uVar14;
    }
    this_01 = local_58;
    uVar13 = (uint)uVar14;
    if ((uVar14 & 0x100000000) == 0) goto switchD_00492e74_default;
    uVar4 = (uint)(uVar14 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar14;
    switch(uVar4) {
    case 100:
      if (cVar12 != '\"') goto switchD_00492e74_default;
      value_00 = mutable_transform_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::TransformationParameter>(input,value_00);
      break;
    case 0x65:
      if (cVar12 != '*') goto switchD_00492e74_default;
      value_22 = mutable_loss_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::LossParameter>
                        (input,value_22);
      break;
    case 0x66:
      if (cVar12 != '2') goto switchD_00492e74_default;
      value_18 = mutable_accuracy_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::AccuracyParameter>(input,value_18);
      break;
    case 0x67:
      if (cVar12 != ':') goto switchD_00492e74_default;
      value_20 = mutable_argmax_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ArgMaxParameter>(input,value_20);
      break;
    case 0x68:
      if (cVar12 != 'B') goto switchD_00492e74_default;
      value_12 = mutable_concat_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ConcatParameter>(input,value_12);
      break;
    case 0x69:
      if (cVar12 != 'J') goto switchD_00492e74_default;
      value_28 = mutable_contrastive_loss_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ContrastiveLossParameter>(input,value_28);
      break;
    case 0x6a:
      if (cVar12 != 'R') goto switchD_00492e74_default;
      value_32 = mutable_convolution_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ConvolutionParameter>(input,value_32);
      break;
    case 0x6b:
      if (cVar12 != 'Z') goto switchD_00492e74_default;
      value_21 = mutable_data_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::DataParameter>
                        (input,value_21);
      break;
    case 0x6c:
      if (cVar12 != 'b') goto switchD_00492e74_default;
      value_36 = mutable_dropout_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::DropoutParameter>(input,value_36);
      break;
    case 0x6d:
      if (cVar12 != 'j') goto switchD_00492e74_default;
      value_15 = mutable_dummy_data_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::DummyDataParameter>(input,value_15);
      break;
    case 0x6e:
      if (cVar12 != 'r') goto switchD_00492e74_default;
      value_35 = mutable_eltwise_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::EltwiseParameter>(input,value_35);
      break;
    case 0x6f:
      if (cVar12 != 'z') goto switchD_00492e74_default;
      value_11 = mutable_exp_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ExpParameter>
                        (input,value_11);
      break;
    case 0x70:
      if (cVar12 != -0x7e) goto switchD_00492e74_default;
      value_14 = mutable_hdf5_data_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::HDF5DataParameter>(input,value_14);
      break;
    case 0x71:
      if (cVar12 != -0x76) goto switchD_00492e74_default;
      value_31 = mutable_hdf5_output_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::HDF5OutputParameter>(input,value_31);
      break;
    case 0x72:
      if (cVar12 != -0x6e) goto switchD_00492e74_default;
      value_09 = mutable_hinge_loss_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::HingeLossParameter>(input,value_09);
      break;
    case 0x73:
      if (cVar12 != -0x66) goto switchD_00492e74_default;
      value_19 = mutable_image_data_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ImageDataParameter>(input,value_19);
      break;
    case 0x74:
      if (cVar12 != -0x5e) goto switchD_00492e74_default;
      value_07 = mutable_infogain_loss_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::InfogainLossParameter>(input,value_07);
      break;
    case 0x75:
      if (cVar12 != -0x56) goto switchD_00492e74_default;
      value_24 = mutable_inner_product_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::InnerProductParameter>(input,value_24);
      break;
    case 0x76:
      if (cVar12 != -0x4e) goto switchD_00492e74_default;
      value_34 = mutable_lrn_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::LRNParameter>
                        (input,value_34);
      break;
    case 0x77:
      if (cVar12 != -0x46) goto switchD_00492e74_default;
      value_42 = mutable_memory_data_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::MemoryDataParameter>(input,value_42);
      break;
    case 0x78:
      if (cVar12 != -0x3e) goto switchD_00492e74_default;
      value_27 = mutable_mvn_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::MVNParameter>
                        (input,value_27);
      break;
    case 0x79:
      if (cVar12 != -0x36) goto switchD_00492e74_default;
      value_29 = mutable_pooling_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PoolingParameter>(input,value_29);
      break;
    case 0x7a:
      if (cVar12 != -0x2e) goto switchD_00492e74_default;
      value_40 = mutable_power_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PowerParameter>(input,value_40);
      break;
    case 0x7b:
      if (cVar12 != -0x26) goto switchD_00492e74_default;
      value_44 = mutable_relu_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ReLUParameter>
                        (input,value_44);
      break;
    case 0x7c:
      if (cVar12 != -0x1e) goto switchD_00492e74_default;
      value_17 = mutable_sigmoid_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::SigmoidParameter>(input,value_17);
      break;
    case 0x7d:
      if (cVar12 != -0x16) goto switchD_00492e74_default;
      value_16 = mutable_softmax_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::SoftmaxParameter>(input,value_16);
      break;
    case 0x7e:
      if (cVar12 != -0xe) goto switchD_00492e74_default;
      value_48 = mutable_slice_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::SliceParameter>(input,value_48);
      break;
    case 0x7f:
      if (cVar12 != -6) goto switchD_00492e74_default;
      value_05 = mutable_tanh_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::TanHParameter>
                        (input,value_05);
      break;
    case 0x80:
      if (cVar12 != '\x02') goto switchD_00492e74_default;
      value_45 = mutable_threshold_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ThresholdParameter>(input,value_45);
      break;
    case 0x81:
      if (cVar12 != '\n') goto switchD_00492e74_default;
      value_46 = mutable_window_data_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::WindowDataParameter>(input,value_46);
      break;
    case 0x82:
      if (cVar12 != '\x12') goto switchD_00492e74_default;
      value_37 = mutable_python_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PythonParameter>(input,value_37);
      break;
    case 0x83:
      if (cVar12 != '\x1a') goto switchD_00492e74_default;
      value_23 = mutable_prelu_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::PReLUParameter>(input,value_23);
      break;
    case 0x84:
      if (cVar12 != '\"') goto switchD_00492e74_default;
      value_38 = mutable_spp_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::SPPParameter>
                        (input,value_38);
      break;
    case 0x85:
      if (cVar12 != '*') goto switchD_00492e74_default;
      value_10 = mutable_reshape_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ReshapeParameter>(input,value_10);
      break;
    case 0x86:
      if (cVar12 != '2') goto switchD_00492e74_default;
      value_06 = mutable_log_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::LogParameter>
                        (input,value_06);
      break;
    case 0x87:
      if (cVar12 != ':') goto switchD_00492e74_default;
      value_03 = mutable_flatten_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::FlattenParameter>(input,value_03);
      break;
    case 0x88:
      if (cVar12 != 'B') goto switchD_00492e74_default;
      value_04 = mutable_reduction_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ReductionParameter>(input,value_04);
      break;
    case 0x89:
      if (cVar12 != 'J') goto switchD_00492e74_default;
      value_02 = mutable_embed_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::EmbedParameter>(input,value_02);
      break;
    case 0x8a:
      if (cVar12 != 'R') goto switchD_00492e74_default;
      value_47 = mutable_tile_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::TileParameter>
                        (input,value_47);
      break;
    case 0x8b:
      if (cVar12 != 'Z') goto switchD_00492e74_default;
      value_41 = mutable_batch_norm_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::BatchNormParameter>(input,value_41);
      break;
    case 0x8c:
      if (cVar12 != 'b') goto switchD_00492e74_default;
      value_13 = mutable_elu_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ELUParameter>
                        (input,value_13);
      break;
    case 0x8d:
      if (cVar12 != 'j') goto switchD_00492e74_default;
      value_26 = mutable_bias_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::BiasParameter>
                        (input,value_26);
      break;
    case 0x8e:
      if (cVar12 != 'r') goto switchD_00492e74_default;
      value_43 = mutable_scale_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ScaleParameter>(input,value_43);
      break;
    case 0x8f:
      if (cVar12 != 'z') goto switchD_00492e74_default;
      value_01 = mutable_input_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::InputParameter>(input,value_01);
      break;
    case 0x90:
      if (cVar12 != -0x7e) goto switchD_00492e74_default;
      value_08 = mutable_crop_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::CropParameter>
                        (input,value_08);
      break;
    case 0x91:
      if (cVar12 != -0x76) goto switchD_00492e74_default;
      value_39 = mutable_parameter_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::ParameterParameter>(input,value_39);
      break;
    case 0x92:
      if (cVar12 != -0x6e) goto switchD_00492e74_default;
      value_49 = mutable_recurrent_param(this);
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<caffe::RecurrentParameter>(input,value_49);
      break;
    default:
      switch(uVar4) {
      case 1:
        if (cVar12 == '\n') {
          psVar10 = mutable_name_abi_cxx11_(this);
          bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar10);
          if (!bVar5) {
            return false;
          }
          psVar10 = (this->name_).ptr_;
          data = (psVar10->_M_dataplus)._M_p;
          size = (int)psVar10->_M_string_length;
          pcVar11 = "caffe.LayerParameter.name";
LAB_004932f4:
          google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,size,PARSE,pcVar11);
          goto LAB_00492d85;
        }
        break;
      case 2:
        if (cVar12 == '\x12') {
          psVar10 = mutable_type_abi_cxx11_(this);
          bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar10);
          if (!bVar5) {
            return false;
          }
          psVar10 = (this->type_).ptr_;
          data = (psVar10->_M_dataplus)._M_p;
          size = (int)psVar10->_M_string_length;
          pcVar11 = "caffe.LayerParameter.type";
          goto LAB_004932f4;
        }
        break;
      case 3:
        if (cVar12 == '\x1a') {
          pbVar8 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_58);
          bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,pbVar8);
          if (!bVar5) {
            return false;
          }
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (this_01,(this->bottom_).super_RepeatedPtrFieldBase.current_size_ + -1)
          ;
          data = (pTVar9->_M_dataplus)._M_p;
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (this_01,(this->bottom_).super_RepeatedPtrFieldBase.current_size_ + -1)
          ;
          size = (int)pTVar9->_M_string_length;
          pcVar11 = "caffe.LayerParameter.bottom";
          goto LAB_004932f4;
        }
        break;
      case 4:
        if (cVar12 == '\"') {
          pbVar8 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(this_00);
          bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,pbVar8);
          if (!bVar5) {
            return false;
          }
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->top_).super_RepeatedPtrFieldBase.current_size_ + -1);
          pcVar11 = (pTVar9->_M_dataplus)._M_p;
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->top_).super_RepeatedPtrFieldBase.current_size_ + -1);
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    (pcVar11,(int)pTVar9->_M_string_length,PARSE,"caffe.LayerParameter.top");
          goto LAB_00492d85;
        }
        break;
      case 5:
        if (cVar12 == '*') {
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                            (input,local_68);
        }
        else {
          if ((uVar13 & 0xff) != 0x2d) break;
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                            (1,0x2d,input,local_68);
        }
        goto LAB_00492e16;
      case 6:
        if (cVar12 != '2') break;
        value_25 = google::protobuf::RepeatedPtrField<caffe::ParamSpec>::Add(local_50);
        bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::ParamSpec>
                          (input,value_25);
        goto LAB_00492e16;
      case 7:
        if (cVar12 != ':') break;
        value_30 = google::protobuf::RepeatedPtrField<caffe::BlobProto>::Add(local_48);
        bVar5 = google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual<caffe::BlobProto>
                          (input,value_30);
        goto LAB_00492e16;
      case 8:
        this_02 = local_40;
        if (cVar12 != 'B') break;
LAB_004934b9:
        value_33 = google::protobuf::RepeatedPtrField<caffe::NetStateRule>::Add(this_02);
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<caffe::NetStateRule>(input,value_33);
        goto LAB_00492e16;
      case 9:
        this_02 = local_38;
        if (cVar12 == 'J') goto LAB_004934b9;
        break;
      case 10:
        if (cVar12 == 'P') {
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                            (input,&value);
          if (!bVar5) {
            return false;
          }
          if ((uint)value < 2) {
            set_phase(this,value);
          }
          else {
            pUVar7 = mutable_unknown_fields(this);
            google::protobuf::UnknownFieldSet::AddVarint(pUVar7,10,(long)value);
          }
          goto LAB_00492d85;
        }
        break;
      case 0xb:
        if (cVar12 == 'Z') {
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,local_60);
        }
        else {
          if ((uVar13 & 0xff) != 0x58) break;
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (1,0x58,input,local_60);
        }
        goto LAB_00492e16;
      }
switchD_00492e74_default:
      if (uVar13 == 0) {
        return true;
      }
      if ((uVar13 & 7) == 4) {
        return true;
      }
      pUVar7 = mutable_unknown_fields(this);
      bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar13,pUVar7);
    }
LAB_00492e16:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool LayerParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LayerParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string type = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type().data(), this->type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string bottom = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_bottom()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->bottom(this->bottom_size() - 1).data(),
            this->bottom(this->bottom_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.bottom");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string top = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_top()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->top(this->top_size() - 1).data(),
            this->top(this->top_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.top");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float loss_weight = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 45u, input, this->mutable_loss_weight())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_loss_weight())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.ParamSpec param = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobProto blobs = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_blobs()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule include = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_include()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule exclude = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_exclude()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.Phase phase = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(10, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool propagate_down = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 88u, input, this->mutable_propagate_down())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_propagate_down())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TransformationParameter transform_param = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_transform_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LossParameter loss_param = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.AccuracyParameter accuracy_param = 102;
      case 102: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_accuracy_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ArgMaxParameter argmax_param = 103;
      case 103: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_argmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConcatParameter concat_param = 104;
      case 104: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_concat_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 105;
      case 105: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(842u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_contrastive_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConvolutionParameter convolution_param = 106;
      case 106: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_convolution_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DataParameter data_param = 107;
      case 107: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DropoutParameter dropout_param = 108;
      case 108: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(866u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dropout_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DummyDataParameter dummy_data_param = 109;
      case 109: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dummy_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EltwiseParameter eltwise_param = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_eltwise_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ExpParameter exp_param = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(890u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_exp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5DataParameter hdf5_data_param = 112;
      case 112: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(898u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5OutputParameter hdf5_output_param = 113;
      case 113: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(906u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_output_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HingeLossParameter hinge_loss_param = 114;
      case 114: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(914u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hinge_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ImageDataParameter image_data_param = 115;
      case 115: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(922u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_image_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InfogainLossParameter infogain_loss_param = 116;
      case 116: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(930u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_infogain_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InnerProductParameter inner_product_param = 117;
      case 117: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(938u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inner_product_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LRNParameter lrn_param = 118;
      case 118: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(946u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_lrn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MemoryDataParameter memory_data_param = 119;
      case 119: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(954u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_memory_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MVNParameter mvn_param = 120;
      case 120: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(962u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mvn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PoolingParameter pooling_param = 121;
      case 121: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(970u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pooling_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PowerParameter power_param = 122;
      case 122: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(978u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_power_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReLUParameter relu_param = 123;
      case 123: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(986u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_relu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SigmoidParameter sigmoid_param = 124;
      case 124: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoid_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SoftmaxParameter softmax_param = 125;
      case 125: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SliceParameter slice_param = 126;
      case 126: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_slice_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TanHParameter tanh_param = 127;
      case 127: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tanh_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ThresholdParameter threshold_param = 128;
      case 128: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_threshold_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.WindowDataParameter window_data_param = 129;
      case 129: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_window_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PythonParameter python_param = 130;
      case 130: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_python_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PReLUParameter prelu_param = 131;
      case 131: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1050u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_prelu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter spp_param = 132;
      case 132: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1058u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_spp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReshapeParameter reshape_param = 133;
      case 133: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1066u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reshape_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LogParameter log_param = 134;
      case 134: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1074u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_log_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FlattenParameter flatten_param = 135;
      case 135: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1082u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_flatten_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReductionParameter reduction_param = 136;
      case 136: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1090u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reduction_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EmbedParameter embed_param = 137;
      case 137: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1098u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_embed_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TileParameter tile_param = 138;
      case 138: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tile_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BatchNormParameter batch_norm_param = 139;
      case 139: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1114u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_batch_norm_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ELUParameter elu_param = 140;
      case 140: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_elu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BiasParameter bias_param = 141;
      case 141: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1130u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ScaleParameter scale_param = 142;
      case 142: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1138u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scale_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InputParameter input_param = 143;
      case 143: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1146u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_input_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.CropParameter crop_param = 144;
      case 144: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1154u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_crop_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ParameterParameter parameter_param = 145;
      case 145: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_parameter_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.RecurrentParameter recurrent_param = 146;
      case 146: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_recurrent_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LayerParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LayerParameter)
  return false;
#undef DO_
}